

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Accuracy::Texture2DFilteringCase::init(Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  int i;
  uint uVar1;
  reference ppTVar2;
  Texture2D *this_01;
  long lVar3;
  long lVar4;
  ulong extraout_RAX;
  int iVar5;
  ulong uVar6;
  pointer ppTVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 gMin;
  Vec4 cScale;
  Vector<float,_4> res_7;
  Vec4 cBias;
  Vector<float,_4> res_6;
  TextureFormatInfo fmtInfo;
  Vec4 local_118;
  ulong local_108;
  uint local_100;
  uint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Vec4 local_e8;
  float local_d8 [6];
  ulong local_c0;
  Vec4 local_b8;
  Texture2D *local_a8;
  float afStack_a0 [2];
  float local_98 [6];
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    iVar5 = 1;
    do {
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_01,this->m_renderCtx,this->m_internalFormat,this->m_width,this->m_height);
      local_70.valueMin.m_data._0_8_ = this_01;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&local_70);
      iVar5 = iVar5 + -1;
    } while (iVar5 == 0);
    uVar9 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar9 = this->m_width;
    }
    uVar8 = 0x20;
    if (uVar9 != 0) {
      uVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x1f;
    }
    tcu::getTextureFormatInfo
              (&local_70,
               (TextureFormat *)
               &(*(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    uVar1 = 0x1f - uVar8;
    local_c0 = (ulong)uVar1;
    local_a8 = (Texture2D *)local_70.valueMin.m_data._0_8_;
    afStack_a0[0] = local_70.valueMin.m_data[2];
    afStack_a0[1] = local_70.valueMin.m_data[3];
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    local_d8[3] = 0.0;
    lVar3 = 0;
    do {
      local_d8[lVar3] = local_70.valueMax.m_data[lVar3] - local_70.valueMin.m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar10 = 4;
    if (uVar9 != 0) {
      local_108 = CONCAT44(local_108._4_4_,0x20 - uVar8);
      uVar10 = 0;
      uVar9 = 0;
      if (0 < (int)uVar1) {
        uVar9 = uVar1;
      }
      do {
        local_f8 = 0xbf000000bf000000;
        uStack_f0 = 0x40000000bf000000;
        local_118.m_data[0] = 0.0;
        local_118.m_data[1] = 0.0;
        local_118.m_data[2] = 0.0;
        local_118.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_118.m_data[lVar3] = *(float *)((long)&local_f8 + lVar3 * 4) * local_d8[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_e8.m_data[lVar3] = local_118.m_data[lVar3] + *(float *)((long)&local_a8 + lVar3 * 4)
          ;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_b8.m_data._0_8_ = &DAT_3f8000003f800000;
        local_b8.m_data[2] = 1.0;
        local_b8.m_data[3] = 0.0;
        local_f8 = 0;
        uStack_f0 = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_f8 + lVar3 * 4) = local_b8.m_data[lVar3] * local_d8[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_118.m_data[0] = 0.0;
        local_118.m_data[1] = 0.0;
        local_118.m_data[2] = 0.0;
        local_118.m_data[3] = 0.0;
        lVar3 = 0;
        do {
          local_118.m_data[lVar3] =
               *(float *)((long)&local_f8 + lVar3 * 4) + *(float *)((long)&local_a8 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        tcu::Texture2D::allocLevel
                  (&(*(this_00->
                      super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                      _M_impl.super__Vector_impl_data._M_start)->m_refTexture,(int)uVar10);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)
                   (uVar10 * 0x28 +
                   *(long *)&((*(this_00->
                                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                             super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl),&local_e8,&local_118);
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9 + 1);
      uVar6 = 0;
      local_108 = 0xffffff / (local_108 & 0xffffffff);
      iVar5 = (int)local_c0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      do {
        tcu::Texture2D::allocLevel
                  (&(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar6);
        uVar9 = (int)uVar6 * (int)local_108;
        local_fc = uVar9 | 0xff000000;
        lVar3 = *(long *)&((this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                          super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl;
        tcu::RGBA::toVec((RGBA *)&local_f8);
        local_100 = ~uVar9 | 0xff000000;
        local_118.m_data[0] = 0.0;
        local_118.m_data[1] = 0.0;
        local_118.m_data[2] = 0.0;
        local_118.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_118.m_data[lVar4] = *(float *)((long)&local_f8 + lVar4 * 4) * local_d8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_e8.m_data[lVar4] = local_118.m_data[lVar4] + *(float *)((long)&local_a8 + lVar4 * 4)
          ;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tcu::RGBA::toVec(local_80);
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        local_98[3] = 0.0;
        lVar4 = 0;
        do {
          local_98[lVar4] = (float)local_80[lVar4].m_value * local_d8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_b8.m_data._0_8_ = (undefined1 *)0x0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_b8.m_data[lVar4] = local_98[lVar4] + *(float *)((long)&local_a8 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tcu::fillWithGrid((PixelBufferAccess *)(uVar6 * 0x28 + lVar3),4,&local_e8,&local_b8);
        uVar6 = uVar6 + 1;
        uVar10 = extraout_RAX;
      } while (uVar6 != iVar5 + 1);
    }
    for (ppTVar7 = (this->m_textures).
                   super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start; iVar5 = (int)uVar10,
        ppTVar7 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar7 = ppTVar7 + 1) {
      uVar9 = (*(*ppTVar7)->_vptr_Texture2D[2])();
      uVar10 = (ulong)uVar9;
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    local_70.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    ppTVar2 = std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
              emplace_back<glu::Texture2D*>
                        ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                         (Texture2D **)&local_70);
    iVar5 = (int)ppTVar2;
  }
  return iVar5;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_internalFormat, m_width, m_height));

			const int				numLevels	= deLog2Floor32(de::max(m_width, m_height))+1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}